

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_map.h
# Opt level: O1

const_iterator __thiscall
ctemplate::
small_map<std::map<unsigned_long,_ctemplate::TemplateString,_std::less<unsigned_long>,_ctemplate::ArenaAllocator<std::pair<const_unsigned_long,_ctemplate::TemplateString>,_ctemplate::UnsafeArena>_>,_4,_std::equal_to<unsigned_long>,_ctemplate::TemplateDictionary::map_arena_init>
::find(small_map<std::map<unsigned_long,_ctemplate::TemplateString,_std::less<unsigned_long>,_ctemplate::ArenaAllocator<std::pair<const_unsigned_long,_ctemplate::TemplateString>,_ctemplate::UnsafeArena>_>,_4,_std::equal_to<unsigned_long>,_ctemplate::TemplateDictionary::map_arena_init>
       *this,key_type *key)

{
  anon_union_160_3_1f8f2db0_for_small_map<std::map<unsigned_long,_ctemplate::TemplateString,_std::less<unsigned_long>,_ctemplate::ArenaAllocator<std::pair<const_unsigned_long,_ctemplate::TemplateString>,_ctemplate::UnsafeArena>_>,_4,_std::equal_to<unsigned_long>,_ctemplate::TemplateDictionary::map_arena_init>_6
  *paVar1;
  _Base_ptr p_Var2;
  ulong uVar3;
  _Base_ptr p_Var4;
  ulong uVar5;
  const_iterator cVar6;
  const_iterator cVar7;
  
  uVar3 = (ulong)(uint)this->size_;
  if (this->size_ < 0) {
    p_Var4 = *(_Base_ptr *)((long)&this->field_2 + 0x18);
    cVar6._M_node = (_Base_ptr)((long)&this->field_2 + 0x10);
    p_Var2 = cVar6._M_node;
    if (p_Var4 != (_Base_ptr)0x0) {
      do {
        if (*(ulong *)(p_Var4 + 1) >= *key) {
          p_Var2 = p_Var4;
        }
        p_Var4 = (&p_Var4->_M_left)[*(ulong *)(p_Var4 + 1) < *key];
      } while (p_Var4 != (_Base_ptr)0x0);
    }
    if ((p_Var2 != cVar6._M_node) && (*(ulong *)(p_Var2 + 1) <= *key)) {
      cVar6._M_node = p_Var2;
    }
    paVar1 = (anon_union_160_3_1f8f2db0_for_small_map<std::map<unsigned_long,_ctemplate::TemplateString,_std::less<unsigned_long>,_ctemplate::ArenaAllocator<std::pair<const_unsigned_long,_ctemplate::TemplateString>,_ctemplate::UnsafeArena>_>,_4,_std::equal_to<unsigned_long>,_ctemplate::TemplateDictionary::map_arena_init>_6
              *)0x0;
  }
  else {
    if (uVar3 != 0) {
      paVar1 = &this->field_2;
      uVar5 = uVar3;
      do {
        if (*(key_type *)paVar1 == *key) goto LAB_0012a861;
        paVar1 = (anon_union_160_3_1f8f2db0_for_small_map<std::map<unsigned_long,_ctemplate::TemplateString,_std::less<unsigned_long>,_ctemplate::ArenaAllocator<std::pair<const_unsigned_long,_ctemplate::TemplateString>,_ctemplate::UnsafeArena>_>,_4,_std::equal_to<unsigned_long>,_ctemplate::TemplateDictionary::map_arena_init>_6
                  *)((long)paVar1 + 0x28);
        uVar5 = uVar5 - 1;
      } while (uVar5 != 0);
    }
    paVar1 = (anon_union_160_3_1f8f2db0_for_small_map<std::map<unsigned_long,_ctemplate::TemplateString,_std::less<unsigned_long>,_ctemplate::ArenaAllocator<std::pair<const_unsigned_long,_ctemplate::TemplateString>,_ctemplate::UnsafeArena>_>,_4,_std::equal_to<unsigned_long>,_ctemplate::TemplateDictionary::map_arena_init>_6
              *)((long)&this->field_2 + uVar3 * 0x28);
LAB_0012a861:
    cVar6._M_node = (_Base_ptr)0x0;
  }
  cVar7.hash_iter_._M_node = cVar6._M_node;
  cVar7.array_iter_ =
       (ManualConstructor<std::pair<const_unsigned_long,_ctemplate::TemplateString>_> *)paVar1;
  return cVar7;
}

Assistant:

const_iterator find(const key_type& key) const {
    key_equal compare;
    if (size_ >= 0) {
      for (int i = 0; i < size_; i++) {
        if (compare(array_[i]->first, key)) {
          return const_iterator(array_ + i);
        }
      }
      return const_iterator(array_ + size_);
    } else {
      return const_iterator(map()->find(key));
    }
  }